

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void move_suite::move_array(void)

{
  size_type in_RCX;
  size_type sVar1;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  basic_variable<std::allocator<char>_> *local_330;
  basic_variable<std::allocator<char>_> *local_310;
  iterator local_300;
  iterator local_2e8;
  iterator local_2d0;
  iterator local_2b8;
  basic_variable<std::allocator<char>_> *local_2a0;
  basic_variable<std::allocator<char>_> local_298;
  basic_variable<std::allocator<char>_> local_268;
  basic_variable<std::allocator<char>_> local_238;
  basic_variable<std::allocator<char>_> local_208;
  undefined1 local_1d8 [24];
  variable expect;
  undefined4 local_18c;
  size_type local_188;
  undefined1 local_17f;
  undefined1 local_17e [2];
  undefined4 local_17c;
  size_type local_178 [2];
  undefined1 local_168 [8];
  variable copy;
  undefined4 local_12c;
  size_type local_128 [3];
  basic_variable<std::allocator<char>_> *local_110;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  local_110 = &local_108;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_110,true);
  local_110 = &local_d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_110,2);
  local_110 = &local_a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_110,3.0);
  local_110 = &local_78;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_110,"alpha");
  local_48._0_8_ = &local_108;
  local_48._8_8_ = 4;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x4;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  local_310 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_310 = local_310 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_310);
  } while (local_310 != &local_108);
  local_128[0] = trial::dynamic::basic_variable<std::allocator<char>_>::size
                           ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_12c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x79b,"void move_suite::move_array()",local_128,&local_12c);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_168,
             (basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_178[0] = trial::dynamic::basic_variable<std::allocator<char>_>::size
                           ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_17c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x79e,"void move_suite::move_array()",local_178,&local_17c);
  local_17e[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_array<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>> *)local_168);
  local_17f = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("copy.is<array>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x79f,"void move_suite::move_array()",local_17e,&local_17f);
  local_188 = trial::dynamic::basic_variable<std::allocator<char>_>::size
                        ((basic_variable<std::allocator<char>_> *)local_168);
  local_18c = 4;
  sVar1 = 0x7a0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("copy.size()","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x7a0,"void move_suite::move_array()",&local_188,&local_18c);
  local_2a0 = &local_298;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_2a0,true);
  local_2a0 = &local_268;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_2a0,2);
  local_2a0 = &local_238;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_2a0,3.0);
  local_2a0 = &local_208;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_2a0,"alpha");
  local_1d8._0_8_ = &local_298;
  local_1d8._8_8_ = 4;
  init_00._M_len = sVar1;
  init_00._M_array = (iterator)0x4;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_1d8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_1d8._0_8_,init_00);
  local_330 = (basic_variable<std::allocator<char>_> *)local_1d8;
  do {
    local_330 = local_330 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_330);
  } while (local_330 != &local_298);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_2b8,(basic_variable<std::allocator<char>_> *)local_168);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_2d0,(basic_variable<std::allocator<char>_> *)local_168);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_2e8,(basic_variable<std::allocator<char>_> *)(local_1d8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_300,(basic_variable<std::allocator<char>_> *)(local_1d8 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x7a5,"void move_suite::move_array()",&local_2b8,&local_2d0,&local_2e8,&local_300);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_300);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_1d8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_168);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void move_array()
{
    variable data = array::make({ true, 2, 3.0, "alpha" });
    TRIAL_PROTOCOL_TEST_EQUAL(data.size(), 4);

    variable copy(std::move(data));
    TRIAL_PROTOCOL_TEST_EQUAL(data.size(), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(copy.is<array>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(copy.size(), 4);

    variable expect = array::make({ true, 2, 3.0, "alpha" });
    TRIAL_PROTOCOL_TEST_ALL_WITH(copy.begin(), copy.end(),
                                 expect.begin(), expect.end(),
                                 std::equal_to<variable>());
}